

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::AppendStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  char *pcVar1;
  ulong in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  anon_class_8_1_ba1d7991 *in_stack_00000050;
  int in_stack_0000005c;
  char *in_stack_00000060;
  EpsCopyInputStream *in_stack_00000068;
  
  if ((long)in_EDX <= (*(long *)(in_RDI + 8) - in_RSI) + (long)*(int *)(in_RDI + 0x1c)) {
    std::__cxx11::string::reserve(in_RCX);
  }
  pcVar1 = AppendSize<google::protobuf::internal::EpsCopyInputStream::AppendStringFallback(char_const*,int,std::__cxx11::string*)::__0>
                     (in_stack_00000068,in_stack_00000060,in_stack_0000005c,in_stack_00000050);
  return pcVar1;
}

Assistant:

const char* EpsCopyInputStream::AppendStringFallback(const char* ptr, int size,
                                                     std::string* str) {
  // TODO(gerbens) assess security. At the moment its parity with
  // CodedInputStream but it allows a payload to reserve large memory.
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    str->reserve(size);
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}